

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O0

uint32_t spvtools::val::anon_unknown_0::NumConsumedComponents
                   (ValidationState_t *_,Instruction *type)

{
  Op OVar1;
  uint uVar2;
  uint32_t uVar3;
  AddressingModel AVar4;
  StorageClass SVar5;
  Instruction *pIVar6;
  uint32_t local_24;
  uint32_t num_components;
  Instruction *type_local;
  ValidationState_t *__local;
  
  local_24 = 0;
  OVar1 = Instruction::opcode(type);
  switch(OVar1) {
  case OpTypeInt:
  case OpTypeFloat:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(type,1);
    if (uVar2 == 0x40) {
      local_24 = 2;
    }
    else {
      local_24 = 1;
    }
    break;
  case OpTypeVector:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar2);
    local_24 = NumConsumedComponents(_,pIVar6);
    uVar2 = Instruction::GetOperandAs<unsigned_int>(type,2);
    local_24 = uVar2 * local_24;
    break;
  default:
    break;
  case OpTypeArray:
    uVar2 = Instruction::GetOperandAs<unsigned_int>(type,1);
    pIVar6 = ValidationState_t::FindDef(_,uVar2);
    uVar3 = NumConsumedComponents(_,pIVar6);
    return uVar3;
  case OpTypePointer:
    AVar4 = ValidationState_t::addressing_model(_);
    if ((AVar4 == AddressingModelPhysicalStorageBuffer64) &&
       (SVar5 = Instruction::GetOperandAs<spv::StorageClass>(type,1), SVar5 == PhysicalStorageBuffer
       )) {
      return 2;
    }
  }
  return local_24;
}

Assistant:

uint32_t NumConsumedComponents(ValidationState_t& _, const Instruction* type) {
  uint32_t num_components = 0;
  switch (type->opcode()) {
    case spv::Op::OpTypeInt:
    case spv::Op::OpTypeFloat:
      // 64-bit types consume two components.
      if (type->GetOperandAs<uint32_t>(1) == 64) {
        num_components = 2;
      } else {
        num_components = 1;
      }
      break;
    case spv::Op::OpTypeVector:
      // Vectors consume components equal to the underlying type's consumption
      // times the number of elements in the vector. Note that 3- and 4-element
      // vectors cannot have a component decoration (i.e. assumed to be zero).
      num_components =
          NumConsumedComponents(_, _.FindDef(type->GetOperandAs<uint32_t>(1)));
      num_components *= type->GetOperandAs<uint32_t>(2);
      break;
    case spv::Op::OpTypeArray:
      // Skip the array.
      return NumConsumedComponents(_,
                                   _.FindDef(type->GetOperandAs<uint32_t>(1)));
    case spv::Op::OpTypePointer:
      if (_.addressing_model() ==
              spv::AddressingModel::PhysicalStorageBuffer64 &&
          type->GetOperandAs<spv::StorageClass>(1) ==
              spv::StorageClass::PhysicalStorageBuffer) {
        return 2;
      }
      break;
    default:
      // This is an error that is validated elsewhere.
      break;
  }

  return num_components;
}